

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainstate.cpp
# Opt level: O0

ChainstateLoadResult *
node::VerifyLoadedChainstate(ChainstateManager *chainman,ChainstateLoadOptions *options)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  VerifyDBResult VVar4;
  reference ppCVar5;
  CBlockIndex *pCVar6;
  long in_RDX;
  ChainstateLoadResult *in_RDI;
  long in_FS_OFFSET;
  VerifyDBResult result;
  CBlockIndex *tip;
  Chainstate *chainstate;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> *__range1;
  iterator __end1;
  iterator __begin1;
  anon_class_8_1_38e0b97e is_coinsview_empty;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  int in_stack_000001e8;
  int in_stack_000001ec;
  ChainstateManager *in_stack_fffffffffffffd78;
  Chainstate *in_stack_fffffffffffffd80;
  Chainstate *in_stack_fffffffffffffd88;
  tuple<node::ChainstateLoadStatus,_bilingual_str> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd9b;
  int in_stack_fffffffffffffd9c;
  CCoinsViewDB *in_stack_fffffffffffffda0;
  Chainstate *in_stack_fffffffffffffda8;
  Chainstate *pCVar7;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffdb0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffffdb8;
  ConstevalStringLiteral in_stack_fffffffffffffdc8;
  int local_1d8;
  tuple<node::ChainstateLoadStatus,_bilingual_str> local_148 [3];
  CCoinsView *in_stack_ffffffffffffffa0;
  Params *in_stack_ffffffffffffffa8;
  Chainstate *in_stack_ffffffffffffffb0;
  CVerifyDB *in_stack_ffffffffffffffb8;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffd78);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8,
             (char *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd9c,
             (bool)in_stack_fffffffffffffd9b);
  ChainstateManager::GetAll((ChainstateManager *)in_stack_fffffffffffffdc8.lit);
  std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::begin
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffffd80);
  std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::end
            ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffffd80);
  do {
    bVar3 = __gnu_cxx::
            operator==<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                      ((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                        *)in_stack_fffffffffffffd88,
                       (__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                        *)in_stack_fffffffffffffd80);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      local_1d8 = 2;
LAB_0112a147:
      std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>::~vector
                ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)in_stack_fffffffffffffd88);
      if (local_1d8 == 2) {
        this = local_148;
        std::__cxx11::string::string(in_stack_fffffffffffffd90);
        std::__cxx11::string::string(in_stack_fffffffffffffd90);
        std::tuple<node::ChainstateLoadStatus,_bilingual_str>::tuple<true,_true>
                  (this,(ChainstateLoadStatus *)in_stack_fffffffffffffd80,
                   (bilingual_str *)in_stack_fffffffffffffd78);
        bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffd78);
      }
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffd78);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
        __stack_chk_fail();
      }
      return in_RDI;
    }
    ppCVar5 = __gnu_cxx::
              __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
              ::operator*((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                           *)in_stack_fffffffffffffd78);
    pCVar7 = *ppCVar5;
    bVar3 = VerifyLoadedChainstate::anon_class_8_1_38e0b97e::operator()
                      ((anon_class_8_1_38e0b97e *)in_stack_fffffffffffffd88,
                       in_stack_fffffffffffffd80);
    if (!bVar3) {
      pCVar6 = CChain::Tip((CChain *)in_stack_fffffffffffffd88);
      if ((pCVar6 != (CBlockIndex *)0x0) &&
         (uVar1 = pCVar6->nTime, in_stack_fffffffffffffdc8.lit = (char *)GetTime(),
         (long)(in_stack_fffffffffffffdc8.lit + 0x1c20) < (long)(ulong)uVar1)) {
        ::_(in_stack_fffffffffffffdc8);
        std::tuple<node::ChainstateLoadStatus,_bilingual_str>::
        tuple<node::ChainstateLoadStatus,_bilingual_str,_true>
                  ((tuple<node::ChainstateLoadStatus,_bilingual_str> *)in_stack_fffffffffffffd88,
                   (ChainstateLoadStatus *)in_stack_fffffffffffffd80,
                   (bilingual_str *)in_stack_fffffffffffffd78);
        bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffd78);
        local_1d8 = 1;
        goto LAB_0112a147;
      }
      ChainstateManager::GetNotifications(in_stack_fffffffffffffd78);
      CVerifyDB::CVerifyDB
                ((CVerifyDB *)in_stack_fffffffffffffda8,(Notifications *)in_stack_fffffffffffffda0);
      ChainstateManager::GetConsensus(in_stack_fffffffffffffd78);
      in_stack_fffffffffffffda0 = Chainstate::CoinsDB(in_stack_fffffffffffffd88);
      VVar4 = CVerifyDB::VerifyDB(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                  in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                                  in_stack_000001ec,in_stack_000001e8);
      CVerifyDB::~CVerifyDB((CVerifyDB *)in_stack_fffffffffffffd88);
      in_stack_fffffffffffffd90 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)VVar4;
      in_stack_fffffffffffffda8 = pCVar7;
      switch(in_stack_fffffffffffffd90) {
      case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
      case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4:
        break;
      case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
        ::_(in_stack_fffffffffffffdc8);
        std::tuple<node::ChainstateLoadStatus,_bilingual_str>::
        tuple<node::ChainstateLoadStatus,_bilingual_str,_true>
                  ((tuple<node::ChainstateLoadStatus,_bilingual_str> *)in_stack_fffffffffffffd88,
                   (ChainstateLoadStatus *)in_stack_fffffffffffffd80,
                   (bilingual_str *)in_stack_fffffffffffffd78);
        bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffd78);
        local_1d8 = 1;
        goto LAB_0112a147;
      case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
        ::_(in_stack_fffffffffffffdc8);
        std::tuple<node::ChainstateLoadStatus,_bilingual_str>::
        tuple<node::ChainstateLoadStatus,_bilingual_str,_true>
                  ((tuple<node::ChainstateLoadStatus,_bilingual_str> *)in_stack_fffffffffffffd88,
                   (ChainstateLoadStatus *)in_stack_fffffffffffffd80,
                   (bilingual_str *)in_stack_fffffffffffffd78);
        bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffd78);
        local_1d8 = 1;
        goto LAB_0112a147;
      case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
        if ((*(byte *)(in_RDX + 0xd) & 1) != 0) {
          ::_(in_stack_fffffffffffffdc8);
          std::tuple<node::ChainstateLoadStatus,_bilingual_str>::
          tuple<node::ChainstateLoadStatus,_bilingual_str,_true>
                    ((tuple<node::ChainstateLoadStatus,_bilingual_str> *)in_stack_fffffffffffffd88,
                     (ChainstateLoadStatus *)in_stack_fffffffffffffd80,
                     (bilingual_str *)in_stack_fffffffffffffd78);
          bilingual_str::~bilingual_str((bilingual_str *)in_stack_fffffffffffffd78);
          local_1d8 = 1;
          goto LAB_0112a147;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>::
    operator++((__normal_iterator<Chainstate_**,_std::vector<Chainstate_*,_std::allocator<Chainstate_*>_>_>
                *)in_stack_fffffffffffffd78);
  } while( true );
}

Assistant:

ChainstateLoadResult VerifyLoadedChainstate(ChainstateManager& chainman, const ChainstateLoadOptions& options)
{
    auto is_coinsview_empty = [&](Chainstate* chainstate) EXCLUSIVE_LOCKS_REQUIRED(::cs_main) {
        return options.wipe_chainstate_db || chainstate->CoinsTip().GetBestBlock().IsNull();
    };

    LOCK(cs_main);

    for (Chainstate* chainstate : chainman.GetAll()) {
        if (!is_coinsview_empty(chainstate)) {
            const CBlockIndex* tip = chainstate->m_chain.Tip();
            if (tip && tip->nTime > GetTime() + MAX_FUTURE_BLOCK_TIME) {
                return {ChainstateLoadStatus::FAILURE, _("The block database contains a block which appears to be from the future. "
                                                         "This may be due to your computer's date and time being set incorrectly. "
                                                         "Only rebuild the block database if you are sure that your computer's date and time are correct")};
            }

            VerifyDBResult result = CVerifyDB(chainman.GetNotifications()).VerifyDB(
                *chainstate, chainman.GetConsensus(), chainstate->CoinsDB(),
                options.check_level,
                options.check_blocks);
            switch (result) {
            case VerifyDBResult::SUCCESS:
            case VerifyDBResult::SKIPPED_MISSING_BLOCKS:
                break;
            case VerifyDBResult::INTERRUPTED:
                return {ChainstateLoadStatus::INTERRUPTED, _("Block verification was interrupted")};
            case VerifyDBResult::CORRUPTED_BLOCK_DB:
                return {ChainstateLoadStatus::FAILURE, _("Corrupted block database detected")};
            case VerifyDBResult::SKIPPED_L3_CHECKS:
                if (options.require_full_verification) {
                    return {ChainstateLoadStatus::FAILURE_INSUFFICIENT_DBCACHE, _("Insufficient dbcache for block verification")};
                }
                break;
            } // no default case, so the compiler can warn about missing cases
        }
    }

    return {ChainstateLoadStatus::SUCCESS, {}};
}